

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

void TorControlConnection::readcb(bufferevent *bev,void *ctx)

{
  int *args;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  void *__ptr;
  Logger *this_00;
  ulong uVar5;
  int iVar6;
  char *__last;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  __integer_from_chars_result_type<int> _Var7;
  size_t n_read_out;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = bufferevent_get_input();
  n_read_out = 0;
  if (lVar4 == 0) {
LAB_00ac4005:
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
                  ,0x59,"static void TorControlConnection::readcb(struct bufferevent *, void *)");
  }
  __ptr = (void *)evbuffer_readln(lVar4,&n_read_out,1);
  if (__ptr != (void *)0x0) {
    args = (int *)((long)ctx + 0x50);
    this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)((long)ctx + 0x58);
    do {
      s._M_dataplus._M_p = (pointer)&s.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&s,__ptr,n_read_out + (long)__ptr);
      free(__ptr);
      if (3 < s._M_string_length) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&s,0,3);
        __last = local_78._M_dataplus._M_p + local_78._M_string_length;
        _Var7 = std::from_chars<int>(local_78._M_dataplus._M_p,__last,&local_7c,10);
        iVar6 = 0;
        if (_Var7.ec == 0) {
          iVar6 = local_7c;
        }
        if (_Var7.ptr != __last) {
          iVar6 = 0;
        }
        *args = iVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&s,4,0xffffffffffffffff);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (s._M_dataplus._M_p[3] == ' ') {
          if (*args < 600) {
            lVar2 = *(long *)((long)ctx + 0x80);
            if (*(long *)((long)ctx + 0xa0) == lVar2) {
              this_00 = LogInstance();
              bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,TOR,Debug);
              if (bVar3) {
                source_file._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
                ;
                source_file._M_len = 0x5e;
                logging_function._M_str = "readcb";
                logging_function._M_len = 6;
                LogPrintFormatInternal<int>
                          (logging_function,source_file,0x71,TOR,Debug,
                           (ConstevalFormatString<1U>)0xfd0ac6,args);
              }
            }
            else {
              if (*(long *)(lVar2 + 0x10) == 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00ac409c;
                std::__throw_bad_function_call();
                goto LAB_00ac4005;
              }
              (**(code **)(lVar2 + 0x18))(lVar2,ctx,args);
              std::
              deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
              ::pop_front((deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
                           *)((long)ctx + 0x70));
            }
          }
          *args = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this,*(pointer *)this);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)s._M_dataplus._M_p != &s.field_2) {
        operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
      }
      __ptr = (void *)evbuffer_readln(lVar4,&n_read_out,1);
    } while (__ptr != (void *)0x0);
  }
  uVar5 = evbuffer_get_length(lVar4);
  if (100000 < uVar5) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "readcb";
    logging_function_00._M_len = 6;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x7b,ALL,Info,(ConstevalFormatString<0U>)0xfd0ae9)
    ;
    if (*(long *)((long)ctx + 0x48) != 0) {
      bufferevent_free();
    }
    *(undefined8 *)((long)ctx + 0x48) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00ac409c:
  __stack_chk_fail();
}

Assistant:

void TorControlConnection::readcb(struct bufferevent *bev, void *ctx)
{
    TorControlConnection *self = static_cast<TorControlConnection*>(ctx);
    struct evbuffer *input = bufferevent_get_input(bev);
    size_t n_read_out = 0;
    char *line;
    assert(input);
    //  If there is not a whole line to read, evbuffer_readln returns nullptr
    while((line = evbuffer_readln(input, &n_read_out, EVBUFFER_EOL_CRLF)) != nullptr)
    {
        std::string s(line, n_read_out);
        free(line);
        if (s.size() < 4) // Short line
            continue;
        // <status>(-|+| )<data><CRLF>
        self->message.code = ToIntegral<int>(s.substr(0, 3)).value_or(0);
        self->message.lines.push_back(s.substr(4));
        char ch = s[3]; // '-','+' or ' '
        if (ch == ' ') {
            // Final line, dispatch reply and clean up
            if (self->message.code >= 600) {
                // (currently unused)
                // Dispatch async notifications to async handler
                // Synchronous and asynchronous messages are never interleaved
            } else {
                if (!self->reply_handlers.empty()) {
                    // Invoke reply handler with message
                    self->reply_handlers.front()(*self, self->message);
                    self->reply_handlers.pop_front();
                } else {
                    LogDebug(BCLog::TOR, "Received unexpected sync reply %i\n", self->message.code);
                }
            }
            self->message.Clear();
        }
    }
    //  Check for size of buffer - protect against memory exhaustion with very long lines
    //  Do this after evbuffer_readln to make sure all full lines have been
    //  removed from the buffer. Everything left is an incomplete line.
    if (evbuffer_get_length(input) > MAX_LINE_LENGTH) {
        LogPrintf("tor: Disconnecting because MAX_LINE_LENGTH exceeded\n");
        self->Disconnect();
    }
}